

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhileCommand.cpp
# Opt level: O3

void __thiscall WhileCommand::doCommand(WhileCommand *this)

{
  pointer *pppCVar1;
  ulong uVar2;
  pointer pcVar3;
  iterator iVar4;
  undefined8 uVar5;
  bool bVar6;
  unsigned_long uVar7;
  ConditionParser *this_00;
  long lVar8;
  const_iterator cVar9;
  iterator iVar10;
  long lVar11;
  int iVar12;
  char cVar13;
  size_type *psVar14;
  undefined8 uVar15;
  bool bVar16;
  undefined1 local_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separetedCopy;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
  stringsToCommands;
  string left;
  undefined1 local_a0 [8];
  string currentComStr;
  ConditionParser *conditionParser;
  string oper;
  string right;
  
  uVar7 = DataCommands::getIndex(this->dataCommands);
  this_00 = (ConditionParser *)(uVar7 + 1);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&separetedCopy.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this->dataCommands);
  if ((ConditionParser *)
      ((long)stringsToCommands._M_h._M_buckets -
       (long)separetedCopy.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage >> 5) <= this_00) goto LAB_0010cbbf;
  stringsToCommands._M_h._M_single_bucket = (__node_base_ptr)&left._M_string_length;
  pcVar3 = separetedCopy.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage[(long)this_00]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stringsToCommands._M_h._M_single_bucket,pcVar3,
             pcVar3 + separetedCopy.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[(long)this_00].
                      _M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&separetedCopy.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&separetedCopy.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this->dataCommands);
  uVar2 = uVar7 + 2;
  if (uVar2 < (ulong)((long)stringsToCommands._M_h._M_buckets -
                      (long)separetedCopy.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage >> 5)) {
    conditionParser = (ConditionParser *)&oper._M_string_length;
    pcVar3 = separetedCopy.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&conditionParser,pcVar3,
               pcVar3 + separetedCopy.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar2]._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&separetedCopy.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    DataCommands::getSeparated_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&separetedCopy.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,this->dataCommands);
    uVar2 = uVar7 + 3;
    if (uVar2 < (ulong)((long)stringsToCommands._M_h._M_buckets -
                        (long)separetedCopy.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 5)) {
      oper.field_2._8_8_ = &right._M_string_length;
      pcVar3 = separetedCopy.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar2]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&oper.field_2 + 8),pcVar3,
                 pcVar3 + separetedCopy.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar2]._M_string_length
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&separetedCopy.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = (ConditionParser *)operator_new(0x38);
      ConditionParser::ConditionParser
                (this_00,(string *)&stringsToCommands._M_h._M_single_bucket,
                 (string *)&conditionParser,(string *)((long)&oper.field_2 + 8),this->dataVars);
      iVar4._M_current =
           (this->deathMap).
           super__Vector_base<ConditionParser_*,_std::allocator<ConditionParser_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      currentComStr.field_2._8_8_ = this_00;
      if (iVar4._M_current ==
          (this->deathMap).super__Vector_base<ConditionParser_*,_std::allocator<ConditionParser_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ConditionParser*,std::allocator<ConditionParser*>>::
        _M_realloc_insert<ConditionParser*const&>
                  ((vector<ConditionParser*,std::allocator<ConditionParser*>> *)&this->deathMap,
                   iVar4,(ConditionParser **)((long)&currentComStr.field_2 + 8));
      }
      else {
        *iVar4._M_current = this_00;
        pppCVar1 = &(this->deathMap).
                    super__Vector_base<ConditionParser_*,_std::allocator<ConditionParser_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      right.field_2._8_8_ = this;
      DataCommands::getStringsToCommands_abi_cxx11_
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
                  *)&separetedCopy.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,this->dataCommands);
      psVar14 = (size_type *)(uVar7 + 4);
      bVar16 = false;
      uVar15 = psVar14;
      left.field_2._8_8_ = psVar14;
      while( true ) {
        bVar6 = ConditionParser::checkCondition((ConditionParser *)currentComStr.field_2._8_8_);
        if (!bVar6) break;
        DataCommands::setIndex(*(DataCommands **)(right.field_2._8_8_ + 8),left.field_2._8_8_);
        DataCommands::getSeparated_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_118,*(DataCommands **)(right.field_2._8_8_ + 8));
        this_00 = (ConditionParser *)((long)local_118 + psVar14 * 0x20);
        iVar12 = 0;
        uVar15 = left.field_2._8_8_;
        do {
          if ((undefined1 *)
              ((long)separetedCopy.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)local_118 >> 5) <=
              (ulong)uVar15) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar15);
            uVar15 = &oper._M_string_length;
LAB_0010cb91:
            std::__throw_out_of_range("_Map_base::at");
            goto LAB_0010cb9d;
          }
          pcVar3 = (((pointer)((long)local_118 + uVar15 * 0x20))->_M_dataplus)._M_p;
          local_a0 = (undefined1  [8])&currentComStr._M_string_length;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar3,
                     pcVar3 + ((pointer)((long)local_118 + uVar15 * 0x20))->_M_string_length);
          cVar13 = (char)(string *)local_a0;
          lVar8 = std::__cxx11::string::find(cVar13,0x7b);
          if (lVar8 == -1) {
            lVar8 = std::__cxx11::string::find(cVar13,0x7d);
            if (lVar8 == -1) {
              cVar9 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)&separetedCopy.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (key_type *)this_00);
              if (cVar9.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
                  ._M_cur == (__node_type *)0x0) {
                this_00 = (ConditionParser *)((this_00->oper).field_2._M_local_buf + 8);
              }
              else {
                iVar10 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&separetedCopy.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (key_type *)this_00);
                if (iVar10.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
                    ._M_cur == (__node_type *)0x0) goto LAB_0010cb91;
                (**(code **)**(undefined8 **)
                              ((long)iVar10.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
                                     ._M_cur + 0x28))();
                uVar15 = DataCommands::getIndex(*(DataCommands **)(right.field_2._8_8_ + 8));
                this_00 = (ConditionParser *)((long)local_118 + uVar15 * 0x20);
              }
            }
            else {
              uVar15 = uVar15 + 1;
              DataCommands::setIndex(*(DataCommands **)(right.field_2._8_8_ + 8),uVar15);
              iVar12 = iVar12 + -1;
            }
          }
          else {
            uVar15 = uVar15 + 1;
            DataCommands::setIndex(*(DataCommands **)(right.field_2._8_8_ + 8),uVar15);
            this_00 = (ConditionParser *)((this_00->oper).field_2._M_local_buf + 8);
            iVar12 = iVar12 + 1;
          }
          if (local_a0 != (undefined1  [8])&currentComStr._M_string_length) {
            operator_delete((void *)local_a0,currentComStr._M_string_length + 1);
          }
        } while (iVar12 != 0);
        this_00 = (ConditionParser *)operator_new(0x38);
        uVar5 = right.field_2._8_8_;
        ConditionParser::ConditionParser
                  (this_00,(string *)&stringsToCommands._M_h._M_single_bucket,
                   (string *)&conditionParser,(string *)((long)&oper.field_2 + 8),
                   *(DataVars **)(right.field_2._8_8_ + 0x10));
        iVar4._M_current = *(ConditionParser ***)(uVar5 + 0x20);
        currentComStr.field_2._8_8_ = this_00;
        if (iVar4._M_current == *(ConditionParser ***)(uVar5 + 0x28)) {
          std::vector<ConditionParser*,std::allocator<ConditionParser*>>::
          _M_realloc_insert<ConditionParser*const&>
                    ((vector<ConditionParser*,std::allocator<ConditionParser*>> *)&this->deathMap,
                     iVar4,(ConditionParser **)((long)&currentComStr.field_2 + 8));
        }
        else {
          *iVar4._M_current = this_00;
          *(long *)(uVar5 + 0x20) = *(long *)(uVar5 + 0x20) + 8;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_118);
        bVar16 = true;
      }
      if (!bVar16) {
        lVar8 = uVar15 << 5;
        iVar12 = 0;
        do {
          DataCommands::getSeparated_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a0,*(DataCommands **)(right.field_2._8_8_ + 8));
          if ((undefined1 *)((long)currentComStr._M_dataplus._M_p - (long)local_a0 >> 5) <=
              (ulong)uVar15) goto LAB_0010cb9d;
          lVar11 = std::__cxx11::string::find(local_a0[0] + (char)lVar8,0x7b);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a0);
          this_00 = (ConditionParser *)0x1;
          if (lVar11 == -1) {
            DataCommands::getSeparated_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a0,*(DataCommands **)(right.field_2._8_8_ + 8));
            if ((undefined1 *)((long)currentComStr._M_dataplus._M_p - (long)local_a0 >> 5) <=
                (ulong)uVar15) goto LAB_0010cbae;
            lVar11 = std::__cxx11::string::find(local_a0[0] + (char)lVar8,0x7d);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a0);
            this_00 = (ConditionParser *)(ulong)-(uint)(lVar11 != -1);
          }
          uVar15 = uVar15 + 1;
          lVar8 = lVar8 + 0x20;
          bVar16 = SCARRY4(iVar12,(int)this_00);
          iVar12 = iVar12 + (int)this_00;
        } while (iVar12 != 0 && bVar16 == iVar12 < 0);
      }
      DataCommands::setIndex(*(DataCommands **)(right.field_2._8_8_ + 8),uVar15);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&separetedCopy.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((size_type *)oper.field_2._8_8_ != &right._M_string_length) {
        operator_delete((void *)oper.field_2._8_8_,right._M_string_length + 1);
      }
      if (conditionParser != (ConditionParser *)&oper._M_string_length) {
        operator_delete(conditionParser,oper._M_string_length + 1);
      }
      if (stringsToCommands._M_h._M_single_bucket != (__node_base_ptr)&left._M_string_length) {
        operator_delete(stringsToCommands._M_h._M_single_bucket,left._M_string_length + 1);
      }
      return;
    }
    goto LAB_0010cbde;
  }
  goto LAB_0010cbd0;
LAB_0010cb9d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15);
LAB_0010cbae:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15);
LAB_0010cbbf:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",this_00);
LAB_0010cbd0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010cbde:
  uVar15 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&separetedCopy.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((size_type *)oper.field_2._8_8_ != &right._M_string_length) {
    operator_delete((void *)oper.field_2._8_8_,right._M_string_length + 1);
  }
  if (conditionParser != (ConditionParser *)&oper._M_string_length) {
    operator_delete(conditionParser,oper._M_string_length + 1);
  }
  if (stringsToCommands._M_h._M_single_bucket != (__node_base_ptr)&left._M_string_length) {
    operator_delete(stringsToCommands._M_h._M_single_bucket,left._M_string_length + 1);
  }
  _Unwind_Resume(uVar15);
}

Assistant:

void WhileCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;

    // get the left from the vector in dataCommands
    string left = this->dataCommands->getSeparated().at(index);
    // skip the left
    index++;

    // get the operator from the vector in dataCommands
    string oper = this->dataCommands->getSeparated().at(index);
    // skip the oper
    index++;

    // get the right from the vector in dataCommands
    string right = this->dataCommands->getSeparated().at(index);
    // skip the right
    index++;

    ConditionParser *conditionParser;
    conditionParser = new ConditionParser(left, oper, right, this->dataVars);
    this->deathMap.push_back(conditionParser);
    unordered_map<string, Command *> stringsToCommands = dataCommands->getStringsToCommands();
    unsigned long oldIndex = index;
    bool isEntered = false;
    while (conditionParser->checkCondition()) {
        isEntered = true;
        index = oldIndex;
        // set the new index of dataCommands
        this->dataCommands->setIndex(oldIndex);
        vector<string> separetedCopy=this->dataCommands->getSeparated();
        auto it1 = separetedCopy.begin();
        it1 += index;
        Command *command;
        int bracesCounter = 0;
        do {
            string currentComStr=separetedCopy.at(index);
            if (currentComStr.find('{') != string::npos) {
                bracesCounter++;
                index++;
                it1++;
                // set the new index of dataCommands
                this->dataCommands->setIndex(index);
                continue;
            } else if (currentComStr.find('}') != string::npos) {
                bracesCounter--;
                index++;
                // set the new index of dataCommands
                this->dataCommands->setIndex(index);
                continue;
            }
            if(stringsToCommands.count(*it1)>=1) {
                command = stringsToCommands.at(*it1);
                command->doCommand();
            }
            else{
                it1++;
                continue;
            }

            index = this->dataCommands->getIndex();
            it1 = separetedCopy.begin();
            it1 += index;

        } while (bracesCounter != 0);
        conditionParser = new ConditionParser(left, oper, right, this->dataVars);
        this->deathMap.push_back(conditionParser);
    }
    if (!isEntered) {
        //right now at '{'. index++ until we get to the last '}'
        int bracesSkipCount = 0;
        do{
            if (this->dataCommands->getSeparated().at(index).find('{') != string::npos) {
                bracesSkipCount++;
            }else if (this->dataCommands->getSeparated().at(index).find('}') != string::npos) {
                bracesSkipCount--;
            }
            index++;
        }while (bracesSkipCount > 0);
    }

    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}